

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O1

Result __thiscall
wabt::MemoryStream::WriteDataImpl(MemoryStream *this,size_t dst_offset,void *src,size_t size)

{
  OutputBuffer *this_00;
  
  if (size != 0) {
    this_00 = (this->buf_)._M_t.
              super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>.
              _M_t.
              super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
              .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl;
    if ((ulong)((long)*(pointer *)
                       ((long)&(this_00->data).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl + 8) -
               *(long *)&(this_00->data).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl)
        < dst_offset + size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this_00->data,dst_offset + size);
    }
    memcpy((void *)(dst_offset +
                   *(long *)&(((this->buf_)._M_t.
                               super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>
                               .super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl)->
                             data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ),src,size);
  }
  return (Result)Ok;
}

Assistant:

Result MemoryStream::WriteDataImpl(size_t dst_offset,
                                   const void* src,
                                   size_t size) {
  if (size == 0) {
    return Result::Ok;
  }
  size_t end = dst_offset + size;
  if (end > buf_->data.size()) {
    buf_->data.resize(end);
  }
  uint8_t* dst = &buf_->data[dst_offset];
  memcpy(dst, src, size);
  return Result::Ok;
}